

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void setnodevector(lua_State *L,Table *t,uint size)

{
  byte bVar1;
  Node *pNVar2;
  undefined8 *puVar3;
  long lVar4;
  ulong uVar5;
  
  if (size == 0) {
    t->node = &dummynode_;
    t->lsizenode = '\0';
    t->flags = t->flags | 0x40;
  }
  else {
    bVar1 = luaO_ceillog2(size);
    if (0x1e < bVar1) {
      luaG_runerror(L,"table overflow");
    }
    uVar5 = (ulong)(uint)(1 << (bVar1 & 0x1f));
    if (bVar1 < 3) {
      pNVar2 = (Node *)luaM_malloc_(L,(ulong)(uint)(0x18 << (bVar1 & 0x1f)),0);
      t->node = pNVar2;
    }
    else {
      puVar3 = (undefined8 *)luaM_malloc_(L,0x18L << (bVar1 & 0x3f) | 8,0);
      t->node = (Node *)(puVar3 + 1);
      *puVar3 = puVar3 + uVar5 * 3 + 1;
    }
    t->lsizenode = bVar1;
    t->flags = t->flags & 0xbf;
    lVar4 = 0xc;
    do {
      pNVar2 = t->node;
      *(undefined4 *)((long)pNVar2 + lVar4) = 0;
      *(undefined2 *)((long)pNVar2 + lVar4 + -4) = 0x10;
      lVar4 = lVar4 + 0x18;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, unsigned size) {
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common 'dummynode' */
    t->lsizenode = 0;
    setdummy(t);  /* signal that it is using dummy node */
  }
  else {
    int i;
    int lsize = luaO_ceillog2(size);
    if (lsize > MAXHBITS || (1 << lsize) > MAXHSIZE)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    if (lsize < LIMFORLAST)  /* no 'lastfree' field? */
      t->node = luaM_newvector(L, size, Node);
    else {
      size_t bsize = size * sizeof(Node) + sizeof(Limbox);
      char *node = luaM_newblock(L, bsize);
      t->node = cast(Node *, node + sizeof(Limbox));
      getlastfree(t) = gnode(t, size);  /* all positions are free */
    }
    t->lsizenode = cast_byte(lsize);
    setnodummy(t);
    for (i = 0; i < cast_int(size); i++) {
      Node *n = gnode(t, i);
      gnext(n) = 0;
      setnilkey(n);
      setempty(gval(n));
    }
  }
}